

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

compute_mul_parity_result
fmt::v11::detail::dragonbox::cache_accessor<double>::compute_mul_parity
          (carrier_uint two_f,cache_entry_type *cache,int beta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  compute_mul_parity_result cVar4;
  ulong uVar5;
  
  if (beta < 1) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O2/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x455,"");
  }
  if ((uint)beta < 0x40) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = two_f;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = cache->lo_;
    uVar5 = SUB168(auVar1 * auVar2,8) + cache->hi_ * two_f;
    bVar3 = (byte)beta & 0x3f;
    cVar4.is_integer = uVar5 << bVar3 == 0 && SUB168(auVar1 * auVar2,0) >> 0x40 - bVar3 == 0;
    cVar4.parity = (uVar5 >> ((ulong)(byte)(0x40 - (byte)beta) & 0x3f) & 1) != 0;
    return cVar4;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O2/_deps/fmt-src/include/fmt/format-inl.h"
              ,0x456,"");
}

Assistant:

static auto compute_mul_parity(carrier_uint two_f,
                                 const cache_entry_type& cache,
                                 int beta) noexcept
      -> compute_mul_parity_result {
    FMT_ASSERT(beta >= 1, "");
    FMT_ASSERT(beta < 64, "");

    auto r = umul192_lower128(two_f, cache);
    return {((r.high() >> (64 - beta)) & 1) != 0,
            ((r.high() << beta) | (r.low() >> (64 - beta))) == 0};
  }